

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

int __thiscall NULLCIO::ReadTextFromConsole(NULLCIO *this,NULLCArray data)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  uint i;
  ulong uVar4;
  uint uVar5;
  char buf [2048];
  NULLCIO local_818 [2056];
  
  i = data.len;
  if (this == (NULLCIO *)0x0) {
    nullcThrowError("ERROR: argument should not be a nullptr",data.ptr,
                    CONCAT44((int)((ulong)register0x00000010 >> 0x20),i));
  }
  else if (readFunc != 0) {
    ReadString((char *)local_818,0x800);
    uVar5 = (uint)data.ptr;
    if (uVar5 != 0) {
      sVar2 = strlen((char *)local_818);
      uVar1 = (int)sVar2 + 1;
      uVar3 = (ulong)data.ptr & 0xffffffff;
      if (uVar1 < uVar5) {
        uVar3 = (ulong)uVar1;
      }
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        this[uVar4] = local_818[uVar4];
      }
      uVar5 = uVar5 - 1;
      this[uVar5] = (NULLCIO)0x0;
      if (uVar1 < uVar5) {
        return uVar1;
      }
      return uVar5;
    }
  }
  return 0;
}

Assistant:

int ReadTextFromConsole(NULLCArray data)
	{
		if(!data.ptr)
		{
			nullcThrowError("ERROR: argument should not be a nullptr");
			return 0;
		}

		if(!readFunc)
			return 0;

		char buf[2048];
		ReadString(buf, 2048);

		if(!data.len)
			return 0;

		unsigned int len = (unsigned int)strlen(buf) + 1;
		char *target = data.ptr;
		for(unsigned int i = 0; i < (data.len < len ? data.len : len); i++)
			target[i] = buf[i];
		target[data.len - 1] = 0;
		
		return ((unsigned int)len < data.len - 1 ? len : data.len - 1);
	}